

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O2

LocalTime * Time::LocalTime::Now(void)

{
  LocalTime *in_RDI;
  __time_t local_20;
  uint local_18;
  
  Time::Now();
  (in_RDI->super_Time).timeSinceEpoch.tv_sec = local_20;
  (in_RDI->super_Time).timeSinceEpoch.tv_usec = (ulong)local_18;
  (in_RDI->super_Time)._vptr_Time = (_func_int **)&PTR_getAsDate_00125cd0;
  return in_RDI;
}

Assistant:

LocalTime LocalTime::Now()
    {
        return toLocal(Time::Now());
    }